

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

void __thiscall clunk::Node::Undo<true>(Node *this,Move *move)

{
  byte *pbVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint type;
  MoveType MVar7;
  int iVar8;
  ulong uVar9;
  int sqr;
  Piece *moved;
  int promo;
  int cap;
  int to;
  int from;
  Move *move_local;
  Node *this_local;
  
  if ((this->state & 1U) == 0) {
    __assert_fail("COLOR(state) == color",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xae7,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  bVar2 = Move::IsValid(move);
  if (!bVar2) {
    __assert_fail("move.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xae8,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  uVar4 = Move::From(move);
  if ((uVar4 & 0xffffff88) != 0) {
    __assert_fail("IS_SQUARE(move.From())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xae9,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  uVar4 = Move::To(move);
  if ((uVar4 & 0xffffff88) != 0) {
    __assert_fail("IS_SQUARE(move.To())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaea,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  iVar5 = Move::From(move);
  if ((undefined *)(&_board)[iVar5] != _EMPTY) {
    __assert_fail("_board[move.From()] == _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaeb,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  iVar5 = Move::Cap(move);
  bVar2 = true;
  if (iVar5 != 0) {
    iVar5 = Move::Cap(move);
    iVar6 = Move::Cap(move);
    bVar2 = 1 < iVar5 && iVar6 < 0xc;
  }
  if (!bVar2) {
    __assert_fail("!move.Cap() || IS_CAP(move.Cap())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaec,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  iVar5 = Move::Cap(move);
  bVar2 = true;
  if (iVar5 != 0) {
    uVar4 = Move::Cap(move);
    bVar2 = (uVar4 & 1) == 0;
  }
  if (!bVar2) {
    __assert_fail("!move.Cap() || (COLOR(move.Cap()) != color)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaed,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  iVar5 = Move::Promo(move);
  bVar2 = true;
  if (iVar5 != 0) {
    iVar5 = Move::Promo(move);
    iVar6 = Move::Promo(move);
    bVar2 = 3 < iVar5 && iVar6 < 0xc;
  }
  if (!bVar2) {
    __assert_fail("!move.Promo() || IS_PROMO(move.Promo())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaee,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  iVar5 = Move::Promo(move);
  bVar2 = true;
  if (iVar5 != 0) {
    uVar4 = Move::Promo(move);
    bVar2 = (uVar4 & 1) != 0;
  }
  if (!bVar2) {
    __assert_fail("!move.Promo() || (COLOR(move.Promo()) == color)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaef,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  _seenIndex = (uint)((_seenIndex != 0 ^ 0xffU) & 1) * 100 + -1 + _seenIndex;
  if (99 < _seenIndex) {
    __assert_fail("(_seenIndex >= 0) & (_seenIndex < MaxPlies)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaf2,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  if (_seenFilter[this->positionKey & 0x3fff] == '\0') {
    __assert_fail("_seenFilter[positionKey & SeenFilterMask]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaf3,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  uVar9 = this->positionKey & 0x3fff;
  _seenFilter[uVar9] = _seenFilter[uVar9] + -1;
  if (_seenStackTop < (undefined *)((long)&_seenStack + 1U)) {
    __assert_fail("_seenStackTop > _seenStack",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaf7,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  _seenStackTop = _seenStackTop + -8;
  iVar5 = Move::From(move);
  uVar4 = Move::To(move);
  iVar6 = Move::Cap(move);
  type = Move::Promo(move);
  pbVar1 = (byte *)(&_board)[(int)uVar4];
  if (pbVar1 == (byte *)0x0 || pbVar1 == _EMPTY) {
    __assert_fail("moved && (moved != _EMPTY)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xb01,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  if (*pbVar1 == 0) {
    __assert_fail("moved->type",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xb02,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  if ((*pbVar1 & 1) == 0) {
    __assert_fail("COLOR(moved->type) == color",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xb03,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  if (pbVar1[1] != uVar4) {
    __assert_fail("moved->sqr == to",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xb04,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  MVar7 = Move::Type(move);
  bVar3 = (byte)iVar5;
  switch(MVar7) {
  case PawnCap:
    if (type == 0) {
      if (iVar6 == 0) {
        if (*pbVar1 != 3) {
          __assert_fail("moved->type == (color|Pawn)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xb27,"void clunk::Node::Undo(const Move &) const [color = true]");
        }
        bVar2 = false;
        if (this->ep != 0x78) {
          bVar2 = uVar4 == this->ep;
        }
        if (!bVar2) {
          __assert_fail("(ep != None) && (to == ep)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xb28,"void clunk::Node::Undo(const Move &) const [color = true]");
        }
        iVar6 = this->ep + 0x10;
        if ((undefined *)(&_board)[iVar6] != _EMPTY) {
          __assert_fail("_board[sqr] == _EMPTY",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xb2a,"void clunk::Node::Undo(const Move &) const [color = true]");
        }
        if (*(long *)(_atk + (long)iVar6 * 8) != 0) {
          TruncateAttacks(iVar6,-1);
        }
        AddPiece(2,iVar6);
        (&_board)[(int)uVar4] = _EMPTY;
        (&_board)[iVar5] = pbVar1;
        pbVar1[1] = bVar3;
        _material = _material + 100;
        if (*(long *)(_atk + (long)iVar5 * 8) != 0) {
          TruncateAttacks(iVar5,uVar4);
        }
        if (*(long *)(_atk + (long)(int)uVar4 * 8) != 0) {
          ExtendAttacks(uVar4);
        }
        if (*(long *)(_atk + (long)iVar6 * 8) != 0) {
          TruncateAttacks(iVar6,iVar5);
        }
        UpdateKingDirs<false>(uVar4,iVar6);
        UpdateKingDirs<true>(uVar4,iVar6);
      }
      else {
        (&_board)[iVar5] = pbVar1;
        pbVar1[1] = bVar3;
        AddPiece(iVar6,uVar4);
        iVar8 = ValueOf(iVar6);
        _material = iVar8 + _material;
        if (*(long *)(_atk + (long)iVar5 * 8) != 0) {
          TruncateAttacks(iVar5,uVar4);
        }
        if (5 < iVar6) {
          AddAttacksFrom(iVar6,uVar4);
        }
      }
    }
    else {
      if (*pbVar1 != type) {
        __assert_fail("moved->type == promo",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb09,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (iVar6 == 0) {
        __assert_fail("cap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb0a,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (5 < (int)type) {
        ClearAttacksFrom(type,uVar4);
      }
      RemovePiece(type,uVar4);
      AddPiece(iVar6,uVar4);
      AddPiece(3,iVar5);
      iVar8 = ValueOf(type);
      DAT_001949b4 = (100 - iVar8) + DAT_001949b4;
      iVar8 = ValueOf(iVar6);
      _material = iVar8 + _material;
      if (*(long *)(_atk + (long)iVar5 * 8) != 0) {
        TruncateAttacks(iVar5,uVar4);
      }
      if (5 < iVar6) {
        AddAttacksFrom(iVar6,uVar4);
      }
    }
    UpdateKingDirs<false>(uVar4,iVar5);
    UpdateKingDirs<true>(uVar4,iVar5);
    break;
  default:
    if (_FIRST_SLIDER <= pbVar1) {
      ClearAttacksFrom((uint)*pbVar1,uVar4);
    }
    if (type == 0) {
      (&_board)[iVar5] = pbVar1;
      pbVar1[1] = bVar3;
    }
    else {
      MVar7 = Move::Type(move);
      if (MVar7 != PawnMove) {
        __assert_fail("move.Type() == PawnMove",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb99,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (*pbVar1 != type) {
        __assert_fail("moved->type == promo",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb9a,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      RemovePiece(type,uVar4);
      AddPiece(3,iVar5);
      iVar8 = ValueOf(type);
      DAT_001949b4 = (100 - iVar8) + DAT_001949b4;
    }
    if (iVar6 == 0) {
      (&_board)[(int)uVar4] = _EMPTY;
    }
    else {
      AddPiece(iVar6,uVar4);
      iVar8 = ValueOf(iVar6);
      _material = iVar8 + _material;
    }
    if (*(long *)(_atk + (long)iVar5 * 8) != 0) {
      TruncateAttacks(iVar5,uVar4);
    }
    if (iVar6 < 6) {
      if ((iVar6 == 0) && (*(long *)(_atk + (long)(int)uVar4 * 8) != 0)) {
        ExtendAttacks(uVar4);
      }
    }
    else {
      AddAttacksFrom(iVar6,uVar4);
    }
    if (_FIRST_SLIDER <= (undefined *)(&_board)[iVar5]) {
      AddAttacksFrom((uint)*(byte *)(&_board)[iVar5],iVar5);
    }
    UpdateKingDirs<false>(uVar4,iVar5);
    UpdateKingDirs<true>(uVar4,iVar5);
    break;
  case KingMove:
    ClearKingDirs<true>(uVar4);
    (&_board)[iVar5] = pbVar1;
    pbVar1[1] = bVar3;
    if (iVar6 == 0) {
      (&_board)[(int)uVar4] = _EMPTY;
    }
    else {
      AddPiece(iVar6,uVar4);
      iVar8 = ValueOf(iVar6);
      _material = iVar8 + _material;
    }
    if (*(long *)(_atk + (long)iVar5 * 8) != 0) {
      TruncateAttacks(iVar5,uVar4);
    }
    if (iVar6 < 6) {
      if ((iVar6 == 0) && (*(long *)(_atk + (long)(int)uVar4 * 8) != 0)) {
        ExtendAttacks(uVar4);
      }
    }
    else {
      AddAttacksFrom(iVar6,uVar4);
    }
    SetKingDirs<true>(iVar5);
    UpdateKingDirs<false>(uVar4,iVar5);
    break;
  case CastleShort:
    if (pbVar1 != PTR_DAT_001883a8) {
      __assert_fail("moved == (color ? _KING[Black] : _KING[White])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb5a,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (iVar5 != 0x74) {
      __assert_fail("from == (color ? E8 : E1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb5b,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (uVar4 != 0x76) {
      __assert_fail("to == (color ? G8 : G1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb5c,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (iVar6 != 0) {
      __assert_fail("!cap",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb5d,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (type != 0) {
      __assert_fail("!promo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb5e,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (DAT_00194850 != _EMPTY) {
      __assert_fail("_board[color ? E8 : E1] == _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb5f,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (DAT_00194868 != _EMPTY) {
      __assert_fail("_board[color ? H8 : H1] == _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb60,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (DAT_00194858 == _EMPTY) {
      __assert_fail("_board[color ? F8 : F1] != _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb61,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (DAT_00194860 == _EMPTY) {
      __assert_fail("_board[color ? G8 : G1] != _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb62,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (*DAT_00194858 != '\t') {
      __assert_fail("_board[color ? F8 : F1]->type == (color|Rook)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb63,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    ClearKingDirs<true>(0x76);
    ClearAttacksFrom(9,0x75);
    DAT_00194860 = _EMPTY;
    DAT_00194868 = DAT_00194858;
    DAT_00194858 = _EMPTY;
    DAT_00194850 = pbVar1;
    pbVar1[1] = bVar3;
    DAT_00194868[1] = 'w';
    SetKingDirs<true>(0x74);
    if (_kingDir[0x7c] == -1) {
      if (_kingDir[0x7d] != -1) {
        __assert_fail("_kingDir[color ? (F8 + 8) : F1] == West",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb6e,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      _kingDir[0x7d] = '\0';
    }
    if (_atk._928_8_ != 0) {
      TruncateAttacks(0x74,0x76);
    }
    AddAttacksFrom(9,0x77);
    break;
  case CastleLong:
    if (pbVar1 != PTR_DAT_001883a8) {
      __assert_fail("moved == (color ? _KING[Black] : _KING[White])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb77,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (iVar5 != 0x74) {
      __assert_fail("from == (color ? E8 : E1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb78,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (uVar4 != 0x72) {
      __assert_fail("to == (color ? C8 : C1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb79,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (iVar6 != 0) {
      __assert_fail("!cap",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb7a,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (type != 0) {
      __assert_fail("!promo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb7b,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (DAT_00194850 != _EMPTY) {
      __assert_fail("_board[color ? E8 : E1] == _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb7c,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (DAT_00194830 != _EMPTY) {
      __assert_fail("_board[color ? A8 : A1] == _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb7d,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (DAT_00194838 != _EMPTY) {
      __assert_fail("_board[color ? B8 : B1] == _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb7e,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (DAT_00194840 == _EMPTY) {
      __assert_fail("_board[color ? C8 : C1] != _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb7f,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (DAT_00194848 == _EMPTY) {
      __assert_fail("_board[color ? D8 : D1] != _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb80,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (*DAT_00194848 != '\t') {
      __assert_fail("_board[color ? D8 : D1]->type == (color|Rook)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb81,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    ClearKingDirs<true>(0x72);
    ClearAttacksFrom(9,0x73);
    DAT_00194830 = DAT_00194848;
    DAT_00194848 = _EMPTY;
    DAT_00194840 = _EMPTY;
    DAT_00194850 = pbVar1;
    pbVar1[1] = bVar3;
    DAT_00194830[1] = 'p';
    SetKingDirs<true>(0x74);
    if (_kingDir[0x7c] == '\x01') {
      if (_kingDir[0x7b] != '\x01') {
        __assert_fail("_kingDir[color ? (D8 + 8) : D1] == East",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb8c,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      _kingDir[0x7b] = '\0';
    }
    if (_atk._928_8_ != 0) {
      TruncateAttacks(0x74,0x72);
    }
    AddAttacksFrom(9,0x70);
  }
  return;
}

Assistant:

void Undo(const Move& move) const {
    assert(COLOR(state) == color);
    assert(move.IsValid());
    assert(IS_SQUARE(move.From()));
    assert(IS_SQUARE(move.To()));
    assert(_board[move.From()] == _EMPTY);
    assert(!move.Cap() || IS_CAP(move.Cap()));
    assert(!move.Cap() || (COLOR(move.Cap()) != color));
    assert(!move.Promo() || IS_PROMO(move.Promo()));
    assert(!move.Promo() || (COLOR(move.Promo()) == color));

    _seenIndex += ((MaxPlies * !_seenIndex) - 1);
    assert((_seenIndex >= 0) & (_seenIndex < MaxPlies));
    assert(_seenFilter[positionKey & SeenFilterMask]);
    _seenFilter[positionKey & SeenFilterMask]--;

#ifndef NDEBUG
    assert(_seenStackTop > _seenStack);
    _seenStackTop--;
#endif

    const int from  = move.From();
    const int to    = move.To();
    const int cap   = move.Cap();
    const int promo = move.Promo();

    Piece* moved = _board[to];
    assert(moved && (moved != _EMPTY));
    assert(moved->type);
    assert(COLOR(moved->type) == color);
    assert(moved->sqr == to);

    switch (move.Type()) {
    case PawnCap:
      if (promo) {
        assert(moved->type == promo);
        assert(cap);
        if (promo >= Bishop) {
          ClearAttacksFrom(promo, to);
        }
        RemovePiece(promo, to);
        AddPiece(cap, to);
        AddPiece((color|Pawn), from);
        _material[color] += (PawnValue - ValueOf(promo));
        _material[!color] += ValueOf(cap);
        if (_atk[from]) {
          TruncateAttacks(from, to);
        }
        if (cap >= Bishop) {
          AddAttacksFrom(cap, to);
        }
      }
      else if (cap) {
        _board[from] = moved;
        moved->sqr = from;
        AddPiece(cap, to);
        _material[!color] += ValueOf(cap);
        if (_atk[from]) {
          TruncateAttacks(from, to);
        }
        if (cap >= Bishop) {
          AddAttacksFrom(cap, to);
        }
      }
      else {
        assert(moved->type == (color|Pawn));
        assert((ep != None) && (to == ep));
        const int sqr = (ep + (color ? North : South));
        assert(_board[sqr] == _EMPTY);
        if (_atk[sqr]) {
          TruncateAttacks(sqr, -1);
        }
        AddPiece(((!color)|Pawn), sqr);
        _board[to] = _EMPTY;
        _board[from] = moved;
        moved->sqr = from;
        _material[!color] += PawnValue;
        if (_atk[from]) {
          TruncateAttacks(from, to);
        }
        if (_atk[to]) {
          ExtendAttacks(to);
        }
        if (_atk[sqr]) {
          TruncateAttacks(sqr, from);
        }
        UpdateKingDirs<White>(to, sqr);
        UpdateKingDirs<Black>(to, sqr);
      }
      UpdateKingDirs<White>(to, from);
      UpdateKingDirs<Black>(to, from);
      break;
    case KingMove:
      ClearKingDirs<color>(to);
      _board[from] = moved;
      moved->sqr = from;
      if (cap) {
        AddPiece(cap, to);
        _material[!color] += ValueOf(cap);
      }
      else {
        _board[to] = _EMPTY;
      }
      if (_atk[from]) {
        TruncateAttacks(from, to);
      }
      if (cap >= Bishop) {
        AddAttacksFrom(cap, to);
      }
      else if (!cap && _atk[to]) {
        ExtendAttacks(to);
      }
      SetKingDirs<color>(from);
      UpdateKingDirs<!color>(to, from);
      break;
    case CastleShort:
      assert(moved == (color ? _KING[Black] : _KING[White]));
      assert(from == (color ? E8 : E1));
      assert(to == (color ? G8 : G1));
      assert(!cap);
      assert(!promo);
      assert(_board[color ? E8 : E1] == _EMPTY);
      assert(_board[color ? H8 : H1] == _EMPTY);
      assert(_board[color ? F8 : F1] != _EMPTY);
      assert(_board[color ? G8 : G1] != _EMPTY);
      assert(_board[color ? F8 : F1]->type == (color|Rook));
      ClearKingDirs<color>(to);
      ClearAttacksFrom((color|Rook), (color ? F8 : F1));
      _board[color ? E8 : E1] = moved;
      _board[color ? G8 : G1] = _EMPTY;
      _board[color ? H8 : H1] = _board[color ? F8 : F1];
      _board[color ? F8 : F1] = _EMPTY;
      moved->sqr = from;
      _board[color ? H8 : H1]->sqr = (color ? H8 : H1);
      SetKingDirs<color>(from);
      if (_kingDir[color ? (E8 + 8) : E1] == West) {
        assert(_kingDir[color ? (F8 + 8) : F1] == West);
        _kingDir[color ? (F8 + 8) : F1] = 0;
      }
      if (_atk[from]) {
        TruncateAttacks(from, to);
      }
      AddAttacksFrom((color|Rook), (color ? H8 : H1));
      break;
    case CastleLong:
      assert(moved == (color ? _KING[Black] : _KING[White]));
      assert(from == (color ? E8 : E1));
      assert(to == (color ? C8 : C1));
      assert(!cap);
      assert(!promo);
      assert(_board[color ? E8 : E1] == _EMPTY);
      assert(_board[color ? A8 : A1] == _EMPTY);
      assert(_board[color ? B8 : B1] == _EMPTY);
      assert(_board[color ? C8 : C1] != _EMPTY);
      assert(_board[color ? D8 : D1] != _EMPTY);
      assert(_board[color ? D8 : D1]->type == (color|Rook));
      ClearKingDirs<color>(to);
      ClearAttacksFrom((color|Rook), (color ? D8 : D1));
      _board[color ? A8 : A1] = _board[color ? D8 : D1];
      _board[color ? D8 : D1] = _EMPTY;
      _board[color ? E8 : E1] = moved;
      _board[color ? C8 : C1] = _EMPTY;
      moved->sqr = from;
      _board[color ? A8 : A1]->sqr = (color ? A8 : A1);
      SetKingDirs<color>(from);
      if (_kingDir[color ? (E8 + 8) : E1] == East) {
        assert(_kingDir[color ? (D8 + 8) : D1] == East);
        _kingDir[color ? (D8 + 8) : D1] = 0;
      }
      if (_atk[from]) {
        TruncateAttacks(from, to);
      }
      AddAttacksFrom((color|Rook), (color ? A8 : A1));
      break;
    default:
      if (moved >= _FIRST_SLIDER) {
        ClearAttacksFrom(moved->type, to);
      }
      if (promo) {
        assert(move.Type() == PawnMove);
        assert(moved->type == promo);
        RemovePiece(promo, to);
        AddPiece((color|Pawn), from);
        _material[color] += (PawnValue - ValueOf(promo));
      }
      else {
        _board[from] = moved;
        moved->sqr = from;
      }
      if (cap) {
        AddPiece(cap, to);
        _material[!color] += ValueOf(cap);
      }
      else {
        _board[to] = _EMPTY;
      }
      if (_atk[from]) {
        TruncateAttacks(from, to);
      }
      if (cap >= Bishop) {
        AddAttacksFrom(cap, to);
      }
      else if (!cap && _atk[to]) {
        ExtendAttacks(to);
      }
      if (_board[from] >= _FIRST_SLIDER) {
        AddAttacksFrom(_board[from]->type, from);
      }
      UpdateKingDirs<White>(to, from);
      UpdateKingDirs<Black>(to, from);
    }

#if 0
    assert(VerifyAttacks(true));
#endif
  }